

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenidmem.cpp
# Opt level: O0

int main(int argsc,char **argsv)

{
  char *__s;
  size_t sVar1;
  Token *this;
  mapped_type *pmVar2;
  ostream *this_00;
  BaseLogger local_328;
  undefined1 local_310 [8];
  Logger log;
  Token *tok;
  string local_2d0;
  undefined1 local_2b0 [8];
  Lexer lex;
  LanguageConfiguration cfg;
  allocator local_1b9;
  string local_1b8 [32];
  istringstream local_198 [8];
  istringstream input;
  char **argsv_local;
  int argsc_local;
  
  if ((argsc == 2) && (sVar1 = strlen(argsv[1]), sVar1 != 0)) {
    __s = argsv[1];
    sVar1 = strlen(__s);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1b8,__s,sVar1 + 1,&local_1b9);
    std::__cxx11::istringstream::istringstream(local_198,local_1b8,8);
    std::__cxx11::string::~string(local_1b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
    lex.lastComment.field_2._10_2_ = 0x100;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2d0,"<args[1]>",(allocator<char> *)((long)&tok + 7));
    pfederc::Lexer::Lexer
              ((Lexer *)local_2b0,(LanguageConfiguration *)((long)&lex.lastComment.field_2 + 10),
               (istream *)local_198,&local_2d0);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&tok + 7));
    this = pfederc::Lexer::next((Lexer *)local_2b0);
    log.baseLog.err._6_2_ = pfederc::Token::getType(this);
    pmVar2 = std::
             unordered_map<pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<pfederc::TokenType>,_std::equal_to<pfederc::TokenType>,_std::allocator<std::pair<const_pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::at((unordered_map<pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<pfederc::TokenType>,_std::equal_to<pfederc::TokenType>,_std::allocator<std::pair<const_pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)pfederc::TOKEN_TYPE_STRINGS_abi_cxx11_,(key_type *)((long)&log.baseLog.err + 6)
                 );
    this_00 = std::operator<<((ostream *)&std::cout,(string *)pmVar2);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    pfederc::BaseLogger::BaseLogger(&local_328,(ostream *)&std::cout,(ostream *)&std::cerr);
    pfederc::Logger::Logger
              ((Logger *)local_310,LVL_FAILURE|LVL_FATAL|LVL_HELP|LVL_NOTE|LVL_ERROR|LVL_WARNING,
               &local_328);
    pfederc::BaseLogger::~BaseLogger(&local_328);
    pfederc::logLexerErrors((Logger *)local_310,(Lexer *)local_2b0);
    pfederc::Logger::~Logger((Logger *)local_310);
    pfederc::Lexer::~Lexer((Lexer *)local_2b0);
    std::__cxx11::istringstream::~istringstream(local_198);
    return 0;
  }
  return 1;
}

Assistant:

int main(int argsc, char * argsv[]) {
  if (argsc != 2 || strlen(argsv[1]) == 0)
    return 1;

  std::istringstream input(std::string(argsv[1], strlen(argsv[1]) + 1));
  LanguageConfiguration cfg = createDefaultLanguageConfiguration();
  Lexer lex(cfg, input, "<args[1]>");
  const Token &tok = lex.next();
  std::cout << TOKEN_TYPE_STRINGS.at(tok.getType()) << std::endl;
  Logger log;
  logLexerErrors(log, lex);
  return 0;
}